

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setMaximizeMode(QMdiSubWindowPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiSubWindow *mdiChild;
  QWidgetData *pQVar5;
  QWidget *this_00;
  Representation RVar6;
  Representation RVar7;
  Representation RVar8;
  bool bVar9;
  int dx1;
  int dy1;
  QMenuBar *menuBar;
  ControlContainer *this_01;
  QAbstractScrollArea *this_02;
  QWidget *pQVar10;
  QScrollBar *this_03;
  QScrollBar *this_04;
  short sVar11;
  long in_FS_OFFSET;
  QSize QVar12;
  QRect QVar13;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mdiChild = *(QMdiSubWindow **)&(this->super_QWidgetPrivate).field_0x8;
  ensureWindowState(this,WindowMaximized);
  this->isShadeMode = false;
  this->isMaximizeMode = true;
  storeFocusWidget(this);
  setSizeGripVisible(this,false);
  if (((this->restoreSize).wd.m_i < 0) || ((this->restoreSize).ht.m_i < 0)) {
    pQVar5 = (mdiChild->super_QWidget).data;
    RVar6.m_i = (pQVar5->crect).y1.m_i;
    RVar7.m_i = (pQVar5->crect).x2.m_i;
    RVar8.m_i = (pQVar5->crect).y2.m_i;
    (this->oldGeometry).x1 = (Representation)(pQVar5->crect).x1.m_i;
    (this->oldGeometry).y1 = (Representation)RVar6.m_i;
    (this->oldGeometry).x2 = (Representation)RVar7.m_i;
    (this->oldGeometry).y2 = (Representation)RVar8.m_i;
    uVar1 = (this->oldGeometry).x2;
    uVar3 = (this->oldGeometry).y2;
    uVar2 = (this->oldGeometry).x1;
    uVar4 = (this->oldGeometry).y1;
    QVar12.wd.m_i = (uVar1 - uVar2) + 1;
    QVar12.ht.m_i = (uVar3 - uVar4) + 1;
    this->restoreSize = QVar12;
  }
  sVar11 = (short)((mdiChild->super_QWidget).data)->widget_attributes;
  if (sVar11 < 0) {
    (**(code **)(*(long *)&mdiChild->super_QWidget + 0x68))(mdiChild,0);
  }
  bVar9 = QPointer::operator_cast_to_bool((QPointer *)&this->baseWidget);
  if ((bVar9) && (this->isWidgetHiddenByUs == true)) {
    QWidget::show((QWidget *)(this->baseWidget).wp.value);
    this->isWidgetHiddenByUs = false;
  }
  updateGeometryConstraints(this);
  if (sVar11 < 0) {
    menuBar = QMdiSubWindowPrivate::menuBar(this);
    if (menuBar == (QMenuBar *)0x0) {
      bVar9 = QPointer::operator_cast_to_bool((QPointer *)&this->controlContainer);
      if (!bVar9) {
        this_01 = (ControlContainer *)operator_new(0x70);
        QMdi::ControlContainer::ControlContainer(this_01,mdiChild);
        QWeakPointer<QObject>::assign<QObject>(&(this->controlContainer).wp,(QObject *)this_01);
      }
    }
    else {
      showButtonsInMenuBar(this,menuBar);
    }
  }
  this_00 = *(QWidget **)(*(long *)&(mdiChild->super_QWidget).field_0x8 + 0x10);
  QVar13 = QWidget::contentsRect(this_00);
  local_48 = QVar13;
  this_02 = (QAbstractScrollArea *)
            QtPrivate::qobject_cast_helper<QAbstractScrollArea*,QObject>
                      (*(QObject **)(*(long *)&this_00->field_0x8 + 0x10));
  if (this_02 != (QAbstractScrollArea *)0x0) {
    pQVar10 = QAbstractScrollArea::viewport(this_02);
    if (pQVar10 == this_00) {
      this_03 = QAbstractScrollArea::horizontalScrollBar(this_02);
      this_04 = QAbstractScrollArea::verticalScrollBar(this_02);
      dy1 = 0;
      dx1 = 0;
      if (this_03 != (QScrollBar *)0x0) {
        dx1 = QAbstractSlider::value(&this_03->super_QAbstractSlider);
      }
      if (this_04 != (QScrollBar *)0x0) {
        dy1 = QAbstractSlider::value(&this_04->super_QAbstractSlider);
      }
      local_48.y1.m_i = QVar13.y1.m_i.m_i - dy1;
      local_48.x1.m_i = QVar13.x1.m_i.m_i - dx1;
      local_48.x2.m_i = QVar13.x2.m_i.m_i - dx1;
      local_48.y2.m_i = QVar13.y2.m_i.m_i - dy1;
      QRect::adjust(&this->oldGeometry,dx1,dy1,dx1,dy1);
    }
  }
  setNewGeometry(this,&local_48);
  ensureWindowState(this,WindowMaximized);
  if (sVar11 < 0) {
    (**(code **)(*(long *)&mdiChild->super_QWidget + 0x68))(mdiChild,1);
  }
  this->resizeEnabled = false;
  this->moveEnabled = false;
  setEnabled(this,MoveAction,false);
  setEnabled(this,MaximizeAction,false);
  setEnabled(this,MinimizeAction,true);
  setEnabled(this,RestoreAction,true);
  setEnabled(this,ResizeAction,this->resizeEnabled);
  restoreFocus(this);
  updateMask(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setMaximizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMaximized);
    isShadeMode = false;
    isMaximizeMode = true;

    storeFocusWidget();

#if QT_CONFIG(sizegrip)
    setSizeGripVisible(false);
#endif

    // Store old geometry and set restore size if not already set.
    if (!restoreSize.isValid()) {
        oldGeometry = q->geometry();
        restoreSize.setWidth(oldGeometry.width());
        restoreSize.setHeight(oldGeometry.height());
    }

    // Hide the window before we change the geometry to avoid multiple resize
    // events and wrong window state.
    const bool wasVisible = q->isVisible();
    if (wasVisible)
        q->setVisible(false);

    // Show the internal widget if it was hidden by us.
    if (baseWidget && isWidgetHiddenByUs) {
        baseWidget->show();
        isWidgetHiddenByUs = false;
    }

    updateGeometryConstraints();

    if (wasVisible) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
        else
#endif
        if (!controlContainer)
            controlContainer = new ControlContainer(q);
    }

    QWidget *parent = q->parentWidget();
    QRect availableRect = parent->contentsRect();

    // Adjust geometry if the sub-window is inside a scroll area.
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent->parentWidget());
    if (scrollArea && scrollArea->viewport() == parent) {
        QScrollBar *hbar = scrollArea->horizontalScrollBar();
        QScrollBar *vbar = scrollArea->verticalScrollBar();
        const int xOffset = hbar ? hbar->value() : 0;
        const int yOffset = vbar ? vbar->value() : 0;
        availableRect.adjust(-xOffset, -yOffset, -xOffset, -yOffset);
        oldGeometry.adjust(xOffset, yOffset, xOffset, yOffset);
    }

    setNewGeometry(&availableRect);
    // QWidget::setGeometry will reset Qt::WindowMaximized so we have to update it here.
    ensureWindowState(Qt::WindowMaximized);

    if (wasVisible)
        q->setVisible(true);

    resizeEnabled = false;
    moveEnabled = false;

#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
    setEnabled(MaximizeAction, false);
    setEnabled(MinimizeAction, true);
    setEnabled(RestoreAction, true);
    setEnabled(ResizeAction, resizeEnabled);
#endif // QT_NO_ACTION

    Q_ASSERT(q->windowState() & Qt::WindowMaximized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMinimized));

    restoreFocus();
    updateMask();
}